

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

void __thiscall cmCTestMultiProcessHandler::StartNextTestsOnTimer(cmCTestMultiProcessHandler *this)

{
  uint uVar1;
  uint64_t timeout;
  
  timeout = 10;
  if (this->FakeLoadForTesting == 0) {
    uVar1 = cmSystemTools::RandomSeed();
    timeout = (uint64_t)((uVar1 % 5) * 1000 + 1000);
  }
  ::cm::uv_timer_ptr::start
            (&this->StartNextTestsOnTimer_,StartNextTestsOnTimer::anon_class_1_0_00000001::__invoke,
             timeout,0);
  return;
}

Assistant:

void cmCTestMultiProcessHandler::StartNextTestsOnTimer()
{
  // Wait between 1 and 5 seconds before trying again.
  unsigned int const milliseconds = this->FakeLoadForTesting
    ? 10
    : (cmSystemTools::RandomSeed() % 5 + 1) * 1000;
  this->StartNextTestsOnTimer_.start(
    [](uv_timer_t* timer) {
      uv_timer_stop(timer);
      auto* self = static_cast<cmCTestMultiProcessHandler*>(timer->data);
      self->StartNextTests();
    },
    milliseconds, 0);
}